

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyGlobals.cpp
# Opt level: O3

void __thiscall wasm::SimplifyGlobals::propagateConstantsToGlobals(SimplifyGlobals *this)

{
  Id IVar1;
  byte bVar2;
  pointer puVar3;
  Global *pGVar4;
  Expression *curr;
  Expression *pEVar5;
  uintptr_t uVar6;
  pointer puVar7;
  pointer puVar8;
  SmallVector<wasm::Literal,_1UL> *this_00;
  Module *pMVar9;
  uintptr_t uVar10;
  byte *pbVar11;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *elementSegment;
  pointer puVar12;
  pointer puVar13;
  pointer puVar14;
  SmallVector<wasm::Literal,_1UL> local_b8;
  undefined1 local_80 [8];
  map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
  constantGlobals;
  Builder builder;
  undefined1 local_40 [8];
  anon_class_16_2_ad9b0d18 applyGlobals;
  
  pMVar9 = this->module;
  applyGlobals.constantGlobals =
       (map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
        *)&constantGlobals._M_t._M_impl.super__Rb_tree_header._M_node_count;
  constantGlobals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&constantGlobals;
  constantGlobals._M_t._M_impl._0_4_ = 0;
  constantGlobals._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  constantGlobals._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  constantGlobals._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_40 = (undefined1  [8])local_80;
  puVar12 = (pMVar9->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (pMVar9->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  constantGlobals._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       constantGlobals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  constantGlobals._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pMVar9;
  if (puVar12 != puVar3) {
    do {
      pGVar4 = (puVar12->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar4->super_Importable).module + 8) == (char *)0x0) {
        propagateConstantsToGlobals::anon_class_16_2_ad9b0d18::operator()
                  ((anon_class_16_2_ad9b0d18 *)local_40,&pGVar4->init);
        curr = ((puVar12->_M_t).
                super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->init;
        pEVar5 = curr;
        IVar1 = curr->_id;
        while (IVar1 == RefAsId) {
          if (1 < *(int *)(pEVar5 + 1) - 1U) goto LAB_00afee89;
          pEVar5 = (Expression *)pEVar5[1].type.id;
          IVar1 = pEVar5->_id;
        }
        if (((0x2a < IVar1 - 0x29) || ((0x40000000005U >> ((ulong)(IVar1 - 0x29) & 0x3f) & 1) == 0))
           && (IVar1 != ConstId)) {
LAB_00afee89:
          if (curr->_id != TupleMakeId) goto LAB_00afef18;
          uVar6 = curr[1].type.id;
          if (uVar6 != 0) {
            uVar10 = 0;
            do {
              for (pbVar11 = *(byte **)(*(long *)(curr + 1) + uVar10 * 8); bVar2 = *pbVar11,
                  bVar2 == 0x51; pbVar11 = *(byte **)(pbVar11 + 0x18)) {
                if (1 < *(int *)(pbVar11 + 0x10) - 1U) goto LAB_00afef18;
              }
              if (((0x2a < bVar2 - 0x29) ||
                  ((0x40000000005U >> ((ulong)(bVar2 - 0x29) & 0x3f) & 1) == 0)) && (bVar2 != 0xe))
              goto LAB_00afef18;
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar6);
          }
        }
        getLiteralsFromConstExpression((Literals *)&local_b8,curr);
        this_00 = &std::
                   map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
                   ::operator[]((map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
                                 *)local_80,
                                (key_type *)
                                (puVar12->_M_t).
                                super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->
                   super_SmallVector<wasm::Literal,_1UL>;
        SmallVector<wasm::Literal,_1UL>::operator=(this_00,&local_b8);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_b8.flexible);
        Literal::~Literal(local_b8.fixed._M_elems);
      }
LAB_00afef18:
      puVar12 = puVar12 + 1;
    } while (puVar12 != puVar3);
    pMVar9 = this->module;
  }
  puVar13 = (pMVar9->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar7 = (pMVar9->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar13 != puVar7) {
    do {
      propagateConstantsToGlobals::anon_class_16_2_ad9b0d18::operator()
                ((anon_class_16_2_ad9b0d18 *)local_40,
                 &((puVar13->_M_t).
                   super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                   .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->offset);
      puVar13 = puVar13 + 1;
    } while (puVar13 != puVar7);
    pMVar9 = this->module;
  }
  puVar14 = (pMVar9->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar8 = (pMVar9->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar14 != puVar8) {
    do {
      propagateConstantsToGlobals::anon_class_16_2_ad9b0d18::operator()
                ((anon_class_16_2_ad9b0d18 *)local_40,
                 &((puVar14->_M_t).
                   super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                   .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->offset);
      puVar14 = puVar14 + 1;
    } while (puVar14 != puVar8);
  }
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Literals>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Literals>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Literals>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Literals>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
               *)local_80);
  return;
}

Assistant:

void propagateConstantsToGlobals() {
    Builder builder(*module);

    // We will note constant globals here as we compute them.
    std::map<Name, Literals> constantGlobals;

    // Given an init expression (something like the init of a global or a
    // segment), see if it is a simple global.get of a constant that we can
    // apply.
    auto applyGlobals = [&](Expression*& init) {
      if (!init) {
        // This is the init of a passive segment, which is null.
        return;
      }
      for (auto** getp : FindAllPointers<GlobalGet>(init).list) {
        auto* get = (*getp)->cast<GlobalGet>();
        auto iter = constantGlobals.find(get->name);
        if (iter != constantGlobals.end()) {
          *getp = builder.makeConstantExpression(iter->second);
        }
      }
    };

    // Go over the list of globals first, and note their constant values as we
    // go, as well as applying them where possible.
    for (auto& global : module->globals) {
      if (!global->imported()) {
        // Apply globals to this value, which may turn it into a constant we can
        // further propagate, or it may already have been one.
        applyGlobals(global->init);
        if (Properties::isConstantExpression(global->init)) {
          constantGlobals[global->name] =
            getLiteralsFromConstExpression(global->init);
        }
      }
    }

    // Go over other things with inits and apply globals there.
    for (auto& elementSegment : module->elementSegments) {
      applyGlobals(elementSegment->offset);
    }
    for (auto& dataSegment : module->dataSegments) {
      applyGlobals(dataSegment->offset);
    }
  }